

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_32sto11u(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  OPJ_INT32 OVar8;
  sbyte sVar9;
  byte *pbVar10;
  ulong uVar11;
  undefined1 *puVar12;
  uint local_4c;
  int remaining;
  uint trailing;
  OPJ_UINT32 src7;
  OPJ_UINT32 src6;
  OPJ_UINT32 src5;
  OPJ_UINT32 src4;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffff8); _src1 = _src1 + 8) {
    uVar1 = pSrc[_src1];
    uVar2 = pSrc[_src1 + 1];
    uVar3 = pSrc[_src1 + 2];
    uVar4 = pSrc[_src1 + 3];
    uVar5 = pSrc[_src1 + 4];
    uVar6 = pSrc[_src1 + 5];
    uVar7 = pSrc[_src1 + 6];
    OVar8 = pSrc[_src1 + 7];
    *(char *)length_local = (char)(uVar1 >> 3);
    *(byte *)(length_local + 1) = (byte)(uVar1 << 5) | (byte)(uVar2 >> 6);
    *(byte *)(length_local + 2) = (byte)(uVar2 << 2) | (byte)(uVar3 >> 9);
    *(char *)(length_local + 3) = (char)(uVar3 >> 1);
    *(byte *)(length_local + 4) = (byte)(uVar3 << 7) | (byte)(uVar4 >> 4);
    *(byte *)(length_local + 5) = (byte)(uVar4 << 4) | (byte)(uVar5 >> 7);
    *(byte *)(length_local + 6) = (byte)(uVar5 << 1) | (byte)(uVar6 >> 10);
    *(char *)(length_local + 7) = (char)(uVar6 >> 2);
    *(byte *)(length_local + 8) = (byte)(uVar6 << 6) | (byte)(uVar7 >> 5);
    puVar12 = (undefined1 *)(length_local + 10);
    *(byte *)(length_local + 9) = (byte)(uVar7 << 3) | (byte)((uint)OVar8 >> 8);
    length_local = length_local + 0xb;
    *puVar12 = (char)OVar8;
  }
  if ((length & 7) != 0) {
    uVar11 = length & 7;
    *(char *)length_local = (char)((uint)pSrc[_src1] >> 3);
    sVar9 = 5;
    local_4c = pSrc[_src1] & 7;
    pbVar10 = (byte *)(length_local + 1);
    if (1 < uVar11) {
      *(byte *)(length_local + 1) = (byte)((uint)pSrc[_src1 + 1] >> 6) | (byte)(local_4c << 5);
      sVar9 = 2;
      local_4c = pSrc[_src1 + 1] & 0x3f;
      pbVar10 = (byte *)(length_local + 2);
      if (2 < uVar11) {
        *(byte *)(length_local + 2) = (byte)((uint)pSrc[_src1 + 2] >> 9) | (byte)(local_4c << 2);
        local_4c = pSrc[_src1 + 2];
        *(char *)(length_local + 3) = (char)((local_4c & 0x1ff) >> 1);
        local_4c = local_4c & 1;
        sVar9 = 7;
        pbVar10 = (byte *)(length_local + 4);
        if (3 < uVar11) {
          *(byte *)(length_local + 4) = (byte)((uint)pSrc[_src1 + 3] >> 4) | (byte)(local_4c << 7);
          sVar9 = 4;
          local_4c = pSrc[_src1 + 3] & 0xf;
          pbVar10 = (byte *)(length_local + 5);
          if (4 < uVar11) {
            *(byte *)(length_local + 5) = (byte)((uint)pSrc[_src1 + 4] >> 7) | (byte)(local_4c << 4)
            ;
            sVar9 = 1;
            local_4c = pSrc[_src1 + 4] & 0x7f;
            pbVar10 = (byte *)(length_local + 6);
            if (5 < uVar11) {
              *(byte *)(length_local + 6) =
                   (byte)((uint)pSrc[_src1 + 5] >> 10) | (byte)(local_4c << 1);
              local_4c = pSrc[_src1 + 5];
              *(char *)(length_local + 7) = (char)((local_4c & 0x3ff) >> 2);
              local_4c = local_4c & 3;
              sVar9 = 6;
              pbVar10 = (byte *)(length_local + 8);
              if (6 < uVar11) {
                *(byte *)(length_local + 8) =
                     (byte)((uint)pSrc[_src1 + 6] >> 5) | (byte)(local_4c << 6);
                sVar9 = 3;
                local_4c = pSrc[_src1 + 6] & 0x1f;
                pbVar10 = (byte *)(length_local + 9);
              }
            }
          }
        }
      }
    }
    length_local = (OPJ_SIZE_T)pbVar10;
    if (sVar9 != 8) {
      *(char *)length_local = (char)(local_4c << sVar9);
    }
  }
  return;
}

Assistant:

static void tif_32sto11u(const OPJ_INT32* pSrc, OPJ_BYTE* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i+0];
		OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i+1];
		OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i+2];
		OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i+3];
		OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i+4];
		OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i+5];
		OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i+6];
		OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i+7];
		
		*pDst++ = (OPJ_BYTE)((src0 >> 3));
		*pDst++ = (OPJ_BYTE)((src0 << 5) | (src1 >> 6));
		*pDst++ = (OPJ_BYTE)((src1 << 2) | (src2 >> 9));
		*pDst++ = (OPJ_BYTE)((src2 >> 1));
		*pDst++ = (OPJ_BYTE)((src2 << 7) | (src3 >> 4));
		*pDst++ = (OPJ_BYTE)((src3 << 4) | (src4 >> 7));
		*pDst++ = (OPJ_BYTE)((src4 << 1) | (src5 >> 10));
		*pDst++ = (OPJ_BYTE)((src5 >> 2));
		*pDst++ = (OPJ_BYTE)((src5 << 6) | (src6 >> 5));
		*pDst++ = (OPJ_BYTE)((src6 << 3) | (src7 >> 8));
		*pDst++ = (OPJ_BYTE)(src7);
	}
	
	if (length & 7U) {
		unsigned int trailing = 0U;
		int remaining = 8U;
		length &= 7U;
		PUTBITS2((OPJ_UINT32)pSrc[i+0], 11)
		if (length > 1U) {
			PUTBITS2((OPJ_UINT32)pSrc[i+1], 11)
			if (length > 2U) {
				PUTBITS2((OPJ_UINT32)pSrc[i+2], 11)
				if (length > 3U) {
					PUTBITS2((OPJ_UINT32)pSrc[i+3], 11)
					if (length > 4U) {
						PUTBITS2((OPJ_UINT32)pSrc[i+4], 11)
						if (length > 5U) {
							PUTBITS2((OPJ_UINT32)pSrc[i+5], 11)
							if (length > 6U) {
								PUTBITS2((OPJ_UINT32)pSrc[i+6], 11)
							}
						}
					}
				}
			}
		}
		FLUSHBITS()
	}
}